

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Bool prvTidyXMLPreserveWhiteSpace(TidyDocImpl *doc,Node *element)

{
  Dict *pDVar1;
  int iVar2;
  Bool BVar3;
  AttVal *pAVar4;
  Parser *pPVar5;
  
  pAVar4 = element->attributes;
  do {
    if (pAVar4 == (AttVal *)0x0) {
      if (element->element == (tmbstr)0x0) {
LAB_0013f147:
        BVar3 = no;
      }
      else if (((element == (Node *)0x0) || (pDVar1 = element->tag, pDVar1 == (Dict *)0x0)) ||
              ((BVar3 = yes, pDVar1->id != TidyTag_PRE &&
               ((pDVar1 == (Dict *)0x0 ||
                ((pDVar1->id != TidyTag_SCRIPT &&
                 ((pDVar1 == (Dict *)0x0 || (pDVar1->id != TidyTag_STYLE)))))))))) {
        pPVar5 = prvTidyFindParser(doc,element);
        if (pPVar5 == prvTidyParsePre) {
LAB_0013f14b:
          BVar3 = yes;
        }
        else {
          iVar2 = prvTidytmbstrcasecmp(element->element,"xsl:text");
          BVar3 = (Bool)(iVar2 == 0);
        }
      }
      return BVar3;
    }
    if ((pAVar4->dict != (Attribute *)0x0) && (pAVar4->dict->id == TidyAttr_XML_SPACE)) {
      if (pAVar4->value == (ctmbstr)0x0) goto LAB_0013f147;
      iVar2 = prvTidytmbstrcasecmp(pAVar4->value,"preserve");
      if (iVar2 != 0) goto LAB_0013f147;
      goto LAB_0013f14b;
    }
    pAVar4 = pAVar4->next;
  } while( true );
}

Assistant:

Bool TY_(XMLPreserveWhiteSpace)( TidyDocImpl* doc, Node *element)
{
    AttVal *attribute;

    /* search attributes for xml:space */
    for (attribute = element->attributes; attribute; attribute = attribute->next)
    {
        if (attrIsXML_SPACE(attribute))
        {
            if (AttrValueIs(attribute, "preserve"))
                return yes;

            return no;
        }
    }

    if (element->element == NULL)
        return no;
        
    /* kludge for html docs without explicit xml:space attribute */
    if (nodeIsPRE(element)    ||
        nodeIsSCRIPT(element) ||
        nodeIsSTYLE(element)  ||
        TY_(FindParser)(doc, element) == TY_(ParsePre))
        return yes;

    /* kludge for XSL docs */
    if ( TY_(tmbstrcasecmp)(element->element, "xsl:text") == 0 )
        return yes;

    return no;
}